

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O2

string * __thiscall helics::InputInfo::getSourceName_abi_cxx11_(InputInfo *this,GlobalHandle source)

{
  int iVar1;
  string *psVar2;
  
  if (getSourceName[abi:cxx11](helics::GlobalHandle)::empty_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getSourceName[abi:cxx11](helics::GlobalHandle)::empty_abi_cxx11_);
    if (iVar1 != 0) {
      getSourceName[abi:cxx11](helics::GlobalHandle)::empty_abi_cxx11_._M_dataplus._M_p =
           (pointer)&getSourceName[abi:cxx11](helics::GlobalHandle)::empty_abi_cxx11_.field_2;
      getSourceName[abi:cxx11](helics::GlobalHandle)::empty_abi_cxx11_._M_string_length = 0;
      getSourceName[abi:cxx11](helics::GlobalHandle)::empty_abi_cxx11_.field_2._M_local_buf[0] =
           '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &getSourceName[abi:cxx11](helics::GlobalHandle)::empty_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&getSourceName[abi:cxx11](helics::GlobalHandle)::empty_abi_cxx11_);
    }
  }
  if ((this->input_sources).
      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->input_sources).
      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
      super__Vector_impl_data._M_start) {
    psVar2 = &getSourceName[abi:cxx11](helics::GlobalHandle)::empty_abi_cxx11_;
  }
  else {
    psVar2 = &((this->source_info).
               super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
               ._M_impl.super__Vector_impl_data._M_start)->key;
  }
  return psVar2;
}

Assistant:

const std::string& InputInfo::getSourceName(GlobalHandle source) const
{
    static const std::string empty{};
    size_t ii{0};
    while (ii < input_sources.size()) {
        if (source == input_sources[ii]) {
            return source_info[ii].key;
        }
    }
    return empty;
}